

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5ModuleDestroy(void *pCtx)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar2 = *(void **)((long)pCtx + 0x40);
  while (pvVar2 != (void *)0x0) {
    pvVar1 = *(void **)((long)pvVar2 + 0x28);
    if (*(code **)((long)pvVar2 + 0x20) != (code *)0x0) {
      (**(code **)((long)pvVar2 + 0x20))(*(undefined8 *)((long)pvVar2 + 0x10));
    }
    sqlite3_free(pvVar2);
    pvVar2 = pvVar1;
  }
  pvVar2 = *(void **)((long)pCtx + 0x48);
  while (pvVar2 != (void *)0x0) {
    pvVar1 = *(void **)((long)pvVar2 + 0x58);
    if (*(code **)((long)pvVar2 + 0x50) != (code *)0x0) {
      (**(code **)((long)pvVar2 + 0x50))(*(undefined8 *)((long)pvVar2 + 8));
    }
    sqlite3_free(pvVar2);
    pvVar2 = pvVar1;
  }
  sqlite3_free(pCtx);
  return;
}

Assistant:

static void fts5ModuleDestroy(void *pCtx){
  Fts5TokenizerModule *pTok, *pNextTok;
  Fts5Auxiliary *pAux, *pNextAux;
  Fts5Global *pGlobal = (Fts5Global*)pCtx;

  for(pAux=pGlobal->pAux; pAux; pAux=pNextAux){
    pNextAux = pAux->pNext;
    if( pAux->xDestroy ) pAux->xDestroy(pAux->pUserData);
    sqlite3_free(pAux);
  }

  for(pTok=pGlobal->pTok; pTok; pTok=pNextTok){
    pNextTok = pTok->pNext;
    if( pTok->xDestroy ) pTok->xDestroy(pTok->pUserData);
    sqlite3_free(pTok);
  }

  sqlite3_free(pGlobal);
}